

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_mpt::llm_build_mpt
          (llm_build_mpt *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint32_t uVar4;
  ggml_tensor *pgVar5;
  undefined8 uVar6;
  const_reference pvVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  size_t sVar10;
  ggml_tensor *pgVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *pgVar14;
  ggml_tensor *pgVar15;
  pointer plVar16;
  ggml_tensor *pgVar17;
  undefined8 in_RCX;
  long in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *attn_norm;
  int il;
  ggml_tensor *inp_pos;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inpL;
  ggml_tensor *pos;
  ggml_tensor *cur;
  int64_t n_embd_gqa;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd28;
  int iVar18;
  llama_hparams *in_stack_fffffffffffffd30;
  ggml_tensor *in_stack_fffffffffffffd38;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffd40;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffd48;
  undefined4 uVar19;
  ggml_tensor *in_stack_fffffffffffffd50;
  ggml_tensor *in_stack_fffffffffffffd80;
  ggml_tensor *in_stack_fffffffffffffd88;
  ggml_tensor *in_stack_fffffffffffffd90;
  ggml_tensor *pgVar20;
  ggml_tensor *pgVar21;
  ggml_tensor *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffdf8;
  ggml_tensor *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe08;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  size_t sVar22;
  int il_00;
  ggml_tensor *in_stack_fffffffffffffe38;
  llm_graph_context *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffef0;
  ggml_tensor *in_stack_fffffffffffffef8;
  ggml_tensor *in_stack_ffffffffffffff20;
  ggml_tensor *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff50;
  ggml_tensor *local_90;
  ggml_tensor *local_88;
  int local_74;
  ggml_tensor *local_60;
  ggml_tensor *local_50;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd40,
             (llm_graph_params *)in_stack_fffffffffffffd38);
  uVar1 = *(uint *)(in_RDI->buffer + 0x24);
  uVar4 = llama_hparams::n_embd_v_gqa
                    (in_stack_fffffffffffffd30,(uint32_t)((ulong)in_stack_fffffffffffffd28 >> 0x20))
  ;
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1733,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_60 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  pgVar15 = local_60;
  pgVar5 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffdd0);
  pgVar17 = pgVar5;
  if (*(long *)(in_RSI + 0x1970) != 0) {
    in_stack_ffffffffffffff30 =
         llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffd90);
    uVar6 = ggml_get_rows(in_RDI->src[5],*(undefined8 *)(in_RSI + 0x1970),in_stack_ffffffffffffff30)
    ;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
    local_60 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_60,uVar6);
    in_stack_ffffffffffffff20 = local_60;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  }
  for (local_74 = 0; iVar18 = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
      (long)local_74 < in_RDI->ne[3]; local_74 = local_74 + 1) {
    pgVar21 = local_60;
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_74);
    pgVar12 = pvVar7->attn_norm;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_74
              );
    pgVar8 = llm_graph_context::build_norm
                       ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                        in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                        (int)in_stack_fffffffffffffd30);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,iVar18);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_74
              );
    pgVar9 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                        in_stack_fffffffffffffd80);
    pgVar20 = pgVar9;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,iVar18);
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_74);
    local_50 = pgVar9;
    if (pvVar7->bqkv != (ggml_tensor *)0x0) {
      pgVar11 = in_RDI->src[5];
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_74);
      local_50 = (ggml_tensor *)ggml_add(pgVar11,pgVar9,pvVar7->bqkv);
      in_stack_fffffffffffffef8 = local_50;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 &in_stack_fffffffffffffd30->vocab_only,iVar18);
      in_stack_fffffffffffffef0 = pgVar9;
    }
    if (0.0 < *(float *)(in_RDI->buffer + 0x18ec)) {
      local_50 = (ggml_tensor *)
                 ggml_clamp((ulong)*(uint *)(in_RDI->buffer + 0x18ec) ^ 0x8000000080000000,
                            in_RDI->src[5],local_50);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 &in_stack_fffffffffffffd30->vocab_only,iVar18);
    }
    pgVar9 = in_RDI->src[5];
    uVar6 = ggml_view_2d(pgVar9,local_50,in_RDI->ne[2],(long)*(int *)(in_RDI->src + 2),
                         local_50->nb[1],0);
    local_88 = (ggml_tensor *)ggml_cont(pgVar9,uVar6);
    pgVar9 = in_RDI->src[5];
    uVar6 = ggml_view_2d(pgVar9,local_50,uVar4,(long)*(int *)(in_RDI->src + 2),local_50->nb[1],
                         in_RDI->ne[2] << 2);
    local_90 = (ggml_tensor *)ggml_cont(pgVar9,uVar6);
    pgVar9 = in_RDI->src[5];
    uVar6 = ggml_view_2d();
    uVar6 = ggml_cont(pgVar9,uVar6);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,iVar18);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,iVar18);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,iVar18);
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_74);
    if (pvVar7->attn_q_norm != (ggml_tensor *)0x0) {
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_74);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_74);
      local_88 = llm_graph_context::build_norm
                           ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48
                            ,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                            (llm_norm_type)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                            (int)in_stack_fffffffffffffd30);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 &in_stack_fffffffffffffd30->vocab_only,iVar18);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_74);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_74);
      local_90 = llm_graph_context::build_norm
                           ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48
                            ,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                            (llm_norm_type)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                            (int)in_stack_fffffffffffffd30);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 &in_stack_fffffffffffffd30->vocab_only,iVar18);
    }
    uVar19 = (undefined4)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    ggml_reshape_3d(in_RDI->src[5],local_88,uVar1,in_RDI->nb[3],(long)*(int *)(in_RDI->src + 2));
    uVar2._0_4_ = in_RDI->op;
    uVar2._4_4_ = in_RDI->op_params[0];
    sVar10 = ggml_reshape_3d(in_RDI->src[5],local_90,uVar1,uVar2,(long)*(int *)(in_RDI->src + 2));
    uVar3._0_4_ = in_RDI->op;
    uVar3._4_4_ = in_RDI->op_params[0];
    pgVar11 = (ggml_tensor *)
              ggml_reshape_3d(in_RDI->src[5],uVar6,uVar1,uVar3,(long)*(int *)(in_RDI->src + 2));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,iVar18);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,iVar18);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,iVar18);
    pgVar9 = pgVar5;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_74
              );
    il_00 = (int)pgVar9;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_74
              );
    sqrtf((float)uVar1);
    pgVar14 = (ggml_tensor *)CONCAT44(uVar19,local_74);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    pgVar9 = pgVar11;
    sVar22 = sVar10;
    local_50 = llm_graph_context::build_attn
                         ((llm_graph_context *)in_stack_ffffffffffffff20,
                          (llm_graph_input_attn_kv_unified *)pgVar8,(ggml_cgraph *)pgVar12,pgVar21,
                          pgVar20,in_stack_fffffffffffffef8,in_stack_ffffffffffffff30,pgVar17,
                          pgVar15,in_RDI,(float)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                          in_stack_ffffffffffffff50);
    type_gate = (llm_ffn_gate_type)sVar22;
    type_op = (llm_ffn_op_type)pgVar9;
    iVar18 = (int)(sVar10 >> 0x20);
    if ((long)local_74 == in_RDI->ne[3] + -1) {
      pgVar12 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffd80)
      ;
      in_stack_fffffffffffffe08 = pgVar12;
      local_50 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_50,pgVar12);
      in_stack_fffffffffffffe00 = local_50;
      in_stack_fffffffffffffdf8 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_60,pgVar12);
      local_60 = in_stack_fffffffffffffdf8;
    }
    pgVar13 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_50,local_60);
    pgVar9 = pgVar13;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)pgVar11,iVar18);
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_74);
    pgVar12 = pvVar7->ffn_norm;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_74
              );
    pgVar14 = llm_graph_context::build_norm
                        ((llm_graph_context *)in_stack_fffffffffffffd50,pgVar14,mw,cur_00,
                         (llm_norm_type)((ulong)pgVar11 >> 0x20),(int)pgVar11);
    pgVar8 = pgVar14;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)pgVar11,iVar18);
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_74);
    pgVar20 = pvVar7->ffn_up;
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_74);
    pgVar21 = pvVar7->ffn_up_b;
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_74);
    in_stack_fffffffffffffd38 = pvVar7->ffn_down;
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_74);
    in_stack_fffffffffffffd40 = pvVar7->ffn_down_b;
    pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)local_74);
    in_stack_fffffffffffffd50 = pvVar7->ffn_act;
    in_stack_fffffffffffffd48 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd30 = (llama_hparams *)0x0;
    in_stack_fffffffffffffd28 = (ggml_tensor *)0x0;
    pgVar12 = llm_graph_context::build_ffn
                        ((llm_graph_context *)in_stack_fffffffffffffdd0,
                         (ggml_tensor *)&stack0xfffffffffffffd28,pgVar21,pgVar20,pgVar14,
                         in_stack_fffffffffffffd38,pgVar12,pgVar8,pgVar9,in_stack_fffffffffffffdf8,
                         in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,type_op,type_gate,il_00
                        );
    in_stack_fffffffffffffdd0 = pgVar12;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
    ggml_add(in_RDI->src[5],pgVar12,pgVar13);
    local_60 = llm_graph_context::build_cvec
                         ((llm_graph_context *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,0
                         );
    in_stack_fffffffffffffd90 = local_60;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  }
  pgVar15 = llm_graph_context::build_norm
                      ((llm_graph_context *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                       in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                       (llm_norm_type)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                       (int)in_stack_fffffffffffffd30);
  pgVar17 = pgVar15;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             &in_stack_fffffffffffffd30->vocab_only,iVar18);
  plVar16 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4c9c45);
  plVar16->t_embd = pgVar15;
  pgVar17 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)in_stack_fffffffffffffd90,pgVar17,
                       in_stack_fffffffffffffd80);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             &in_stack_fffffffffffffd30->vocab_only,iVar18);
  plVar16 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4c9cca);
  plVar16->t_logits = pgVar17;
  ggml_build_forward_expand(in_RCX,pgVar17);
  return;
}

Assistant:

llm_build_mpt(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * pos;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        auto * inp_attn = build_attn_inp_kv_unified();

        if (model.pos_embd) {
            // inp_pos - contains the positions
            ggml_tensor * inp_pos = build_inp_pos();
            pos = ggml_get_rows(ctx0, model.pos_embd, inp_pos);
            cb(pos, "pos_embd", -1);

            inpL = ggml_add(ctx0, inpL, pos);
            cb(inpL, "inpL", -1);
        }

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * attn_norm;

            attn_norm = build_norm(inpL,
                    model.layers[il].attn_norm,
                    model.layers[il].attn_norm_b,
                    LLM_NORM, il);
            cb(attn_norm, "attn_norm", il);

            // self-attention
            {
                cur = attn_norm;

                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                if (model.layers[il].bqkv){
                    cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                    cb(cur, "bqkv", il);
                }

                if (hparams.f_clamp_kqv > 0.0f) {
                    cur = ggml_clamp(ctx0, cur, -hparams.f_clamp_kqv, hparams.f_clamp_kqv);
                    cb(cur, "wqkv_clamped", il);
                }

                ggml_tensor * Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                ggml_tensor * Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                ggml_tensor * Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                // Q/K Layernorm
                if (model.layers[il].attn_q_norm) {
                    Qcur = build_norm(Qcur,
                            model.layers[il].attn_q_norm,
                            model.layers[il].attn_q_norm_b,
                            LLM_NORM, il);
                    cb(Qcur, "Qcur", il);

                    Kcur = build_norm(Kcur,
                            model.layers[il].attn_k_norm,
                            model.layers[il].attn_k_norm_b,
                            LLM_NORM, il);
                    cb(Kcur, "Kcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            // Add the input
            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
            cb(ffn_inp, "ffn_inp", il);

            // feed forward
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm,
                        model.layers[il].ffn_norm_b,
                        LLM_NORM, il);
                cb(cur, "ffn_norm", il);
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        NULL,                      NULL,                        NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        model.layers[il].ffn_act,
                        LLM_FFN_GELU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }